

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O1

int Extra_bddCheckVarsSymmetric(DdManager *dd,DdNode *bF,int iVar1,int iVar2)

{
  DdNode *pDVar1;
  DdNode *n;
  DdNode *pDVar2;
  
  if (iVar1 == iVar2) {
    __assert_fail("iVar1 != iVar2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                  ,0x173,"int Extra_bddCheckVarsSymmetric(DdManager *, DdNode *, int, int)");
  }
  if (iVar1 < dd->size) {
    if (iVar2 < dd->size) {
      n = Cudd_bddAnd(dd,dd->vars[iVar1],dd->vars[iVar2]);
      Cudd_Ref(n);
      pDVar2 = extraBddCheckVarsSymmetric(dd,bF,n);
      pDVar1 = dd->one;
      Cudd_RecursiveDeref(dd,n);
      return (int)(pDVar2 == pDVar1);
    }
    __assert_fail("iVar2 < dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                  ,0x175,"int Extra_bddCheckVarsSymmetric(DdManager *, DdNode *, int, int)");
  }
  __assert_fail("iVar1 < dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                ,0x174,"int Extra_bddCheckVarsSymmetric(DdManager *, DdNode *, int, int)");
}

Assistant:

int Extra_bddCheckVarsSymmetric( 
  DdManager * dd,   /* the DD manager */
  DdNode * bF,
  int iVar1,
  int iVar2) 
{
    DdNode * bVars;
    int Res;

//  return 1;

    assert( iVar1 != iVar2 );
    assert( iVar1 < dd->size );
    assert( iVar2 < dd->size );

    bVars = Cudd_bddAnd( dd, dd->vars[iVar1], dd->vars[iVar2] );   Cudd_Ref( bVars );

    Res = (int)( extraBddCheckVarsSymmetric( dd, bF, bVars ) == b1 );

    Cudd_RecursiveDeref( dd, bVars );

    return Res;
}